

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O0

void __thiscall rest_rpc::rpc_service::rpc_server::do_accept(rpc_server *this)

{
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this_00;
  element_type *__f;
  element_type *peVar1;
  int __protocol;
  int __type;
  int __domain;
  router *in_RDI;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>)>
  *in_stack_ffffffffffffff78;
  connection *in_stack_ffffffffffffff80;
  connection *in_stack_ffffffffffffff88;
  type tVar2;
  io_service_pool *in_stack_ffffffffffffff90;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>)>
  *this_01;
  size_t *peer;
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *timeout_seconds;
  io_service *in_stack_ffffffffffffffb8;
  connection *in_stack_ffffffffffffffc0;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>)>
  local_38;
  
  peer = &in_RDI[1].map_invokers_._M_h._M_rehash_policy._M_next_resize;
  this_00 = (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)operator_new(0x1e0);
  timeout_seconds = this_00;
  io_service_pool::get_io_service(in_stack_ffffffffffffff90);
  connection::connection
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)timeout_seconds,in_RDI);
  std::__shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>::
  reset<rest_rpc::rpc_service::connection>
            ((__shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __f = std::
        __shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1c326b);
  this_01 = &local_38;
  peVar1 = __f;
  std::
  function<void(std::__cxx11::string,std::__cxx11::string,std::weak_ptr<rest_rpc::rpc_service::connection>)>
  ::
  function<rest_rpc::rpc_service::rpc_server::do_accept()::_lambda(std::__cxx11::string,std::__cxx11::string,std::weak_ptr<rest_rpc::rpc_service::connection>)_1_,void>
            (this_01,(anon_class_8_1_8991fb9c *)__f);
  tVar2 = (type)((ulong)peVar1 >> 0x20);
  __protocol = (int)__f;
  __domain = (int)this_01;
  connection::set_callback(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>)>
  ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>)>
               *)0x1c32ac);
  peVar1 = std::
           __shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1c32c9);
  connection::socket(peVar1,__domain,__type,__protocol);
  asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
  async_accept<asio::ip::tcp,asio::any_io_executor,rest_rpc::rpc_service::rpc_server::do_accept()::_lambda(std::error_code)_1_>
            (this_00,(basic_socket<asio::ip::tcp,_asio::any_io_executor> *)peer,
             (anon_class_8_1_8991fb9c *)this_01,tVar2);
  return;
}

Assistant:

void do_accept() {
    conn_.reset(new connection(io_service_pool_.get_io_service(),
                               timeout_seconds_, router_));
    conn_->set_callback([this](std::string key, std::string token,
                               std::weak_ptr<connection> conn) {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      sub_map_.emplace(std::move(key) + token, conn);
      if (!token.empty()) {
        token_list_.emplace(std::move(token));
      }
    });

    acceptor_.async_accept(conn_->socket(), [this](asio::error_code ec) {
      if (!acceptor_.is_open()) {
        return;
      }

      if (ec) {
        // LOG(INFO) << "acceptor error: " <<
        // ec.message();
      } else {
#ifdef CINATRA_ENABLE_SSL
        if (!ssl_conf_.cert_file.empty()) {
          conn_->init_ssl_context(ssl_conf_);
        }
#endif
        if (on_net_err_callback_) {
          conn_->on_network_error(on_net_err_callback_);
        }
        conn_->start();
        std::unique_lock<std::mutex> lock(mtx_);
        conn_->set_conn_id(conn_id_);
        connections_.emplace(conn_id_++, conn_);
      }

      do_accept();
    });
  }